

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

time_t __thiscall booster::locale::date_time::time(date_time *this,time_t *__timer)

{
  int iVar1;
  undefined4 extraout_var;
  double in_XMM0_Qa;
  posix_time ptime;
  
  floor(in_XMM0_Qa);
  iVar1 = (*((this->impl_).ptr_)->_vptr_abstract_calendar[4])();
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

void date_time::time(double v)
{
    double dseconds = floor(v);
    int64_t seconds = static_cast<int64_t>(dseconds);
    double fract = v - dseconds;
    int nano = static_cast<int>(fract * 1e9);
    if(nano < 0)
        nano = 0;
    else if(nano >999999999)
        nano = 999999999;
    posix_time ptime;
    ptime.seconds = seconds;
    ptime.nanoseconds = nano;
    impl_->set_time(ptime);
}